

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::HomeDirectorySetting::SetLocal(ClientContext *context,Value *input)

{
  bool bVar1;
  ClientConfig *this;
  InvalidInputException *this_00;
  string local_68;
  string local_48;
  
  this = ClientConfig::GetConfig(context);
  if (input->is_null == false) {
    FileSystem::GetFileSystem(context);
    Value::ToString_abi_cxx11_(&local_48,input);
    bVar1 = FileSystem::IsRemoteFile(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1 != false) {
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Cannot set the home directory to a remote path","");
    InvalidInputException::InvalidInputException(this_00,&local_68);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (input->is_null == true) {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    Value::ToString_abi_cxx11_(&local_68,input);
  }
  ::std::__cxx11::string::operator=((string *)this,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HomeDirectorySetting::SetLocal(ClientContext &context, const Value &input) {
	auto &config = ClientConfig::GetConfig(context);
	if (!input.IsNull() && FileSystem::GetFileSystem(context).IsRemoteFile(input.ToString())) {
		throw InvalidInputException("Cannot set the home directory to a remote path");
	}
	config.home_directory = input.IsNull() ? string() : input.ToString();
}